

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

void __thiscall icu_63::Calendar::setTimeInMillis(Calendar *this,double millis,UErrorCode *status)

{
  undefined1 auVar1 [16];
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long lVar4;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (millis <= 1.838821689216e+17) {
      if ((millis < -1.84303902528e+17) && (millis = -1.84303902528e+17, this->fLenient == '\0'))
      goto LAB_001e783a;
    }
    else {
      if (this->fLenient == '\0') {
LAB_001e783a:
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return;
      }
      millis = 1.838821689216e+17;
    }
    this->fTime = millis;
    this->fIsTimeSet = '\x01';
    this->fAreFieldsSet = '\0';
    this->fAreAllFieldsSet = '\0';
    this->fAreFieldsVirtuallySet = '\x01';
    this->fFields[0] = 0;
    this->fFields[1] = 0;
    this->fFields[2] = 0;
    this->fFields[3] = 0;
    this->fFields[4] = 0;
    this->fFields[5] = 0;
    this->fFields[6] = 0;
    this->fFields[7] = 0;
    this->fFields[8] = 0;
    this->fFields[9] = 0;
    this->fFields[10] = 0;
    this->fFields[0xb] = 0;
    this->fFields[0xc] = 0;
    this->fFields[0xd] = 0;
    this->fFields[0xe] = 0;
    this->fFields[0xf] = 0;
    this->fFields[0x10] = 0;
    this->fFields[0x11] = 0;
    this->fFields[0x12] = 0;
    this->fFields[0x13] = 0;
    this->fFields[0x14] = 0;
    this->fFields[0x15] = 0;
    *(undefined8 *)(this->fFields + 0x16) = 0;
    this->fIsSet[4] = '\0';
    this->fIsSet[5] = '\0';
    this->fIsSet[6] = '\0';
    this->fIsSet[7] = '\0';
    this->fIsSet[8] = '\0';
    this->fIsSet[9] = '\0';
    this->fIsSet[10] = '\0';
    this->fIsSet[0xb] = '\0';
    this->fIsSet[0xc] = '\0';
    this->fIsSet[0xd] = '\0';
    this->fIsSet[0xe] = '\0';
    this->fIsSet[0xf] = '\0';
    this->fIsSet[0x10] = '\0';
    this->fIsSet[0x11] = '\0';
    this->fIsSet[0x12] = '\0';
    this->fIsSet[0x13] = '\0';
    this->fIsSet[0x13] = '\0';
    auVar1 = _DAT_002f6260;
    this->fIsSet[0x14] = '\0';
    this->fIsSet[0x15] = '\0';
    this->fIsSet[0x16] = '\0';
    lVar2 = 0;
    auVar3 = _DAT_002f6240;
    auVar5 = _DAT_002f6250;
    do {
      auVar6 = auVar5 ^ auVar1;
      if (auVar6._4_4_ == -0x80000000 && auVar6._0_4_ < -0x7fffffe9) {
        this->fStamp[lVar2] = 0;
        this->fStamp[lVar2 + 1] = 0;
      }
      auVar6 = auVar3 ^ auVar1;
      if (auVar6._4_4_ == -0x80000000 && auVar6._0_4_ < -0x7fffffe9) {
        this->fStamp[lVar2 + 2] = 0;
        this->fStamp[lVar2 + 3] = 0;
      }
      lVar2 = lVar2 + 4;
      lVar4 = auVar5._8_8_;
      auVar5._0_8_ = auVar5._0_8_ + 4;
      auVar5._8_8_ = lVar4 + 4;
      lVar4 = auVar3._8_8_;
      auVar3._0_8_ = auVar3._0_8_ + 4;
      auVar3._8_8_ = lVar4 + 4;
    } while (lVar2 != 0x18);
  }
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }